

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int valid_nifti_brick_list(nifti_image *nim,int nbricks,int *blist,int disp_error)

{
  uint uVar1;
  ulong uVar2;
  char *__ptr;
  int iVar3;
  long lVar4;
  size_t sStack_10;
  
  if (nim == (nifti_image *)0x0) {
    if ((disp_error == 0) && (g_opts_0 < 1)) {
      return 0;
    }
    __ptr = "** valid_nifti_brick_list: missing nifti image\n";
    sStack_10 = 0x2f;
  }
  else {
    if (0 < nbricks && blist != (int *)0x0) {
      uVar1 = nim->dim[0];
      if ((int)uVar1 < 3) {
        if ((disp_error != 0) || (1 < g_opts_0)) {
          fprintf(_stderr,"** cannot read explict brick list from %d-D dataset\n",(ulong)uVar1);
          return 0;
        }
      }
      else {
        iVar3 = 1;
        for (lVar4 = 0; (ulong)uVar1 - 3 != lVar4; lVar4 = lVar4 + 1) {
          iVar3 = iVar3 * nim->dim[lVar4 + 4];
        }
        if (iVar3 < 1) {
          fprintf(_stderr,"** VNBL warning: bad dim list (%d,%d,%d,%d)\n",(ulong)(uint)nim->dim[4],
                  (ulong)(uint)nim->dim[5],(ulong)(uint)nim->dim[6],(ulong)(uint)nim->dim[7]);
          return 0;
        }
        uVar2 = 0;
        while( true ) {
          if ((uint)nbricks == uVar2) {
            return 1;
          }
          uVar1 = blist[uVar2];
          if (((int)uVar1 < 0) || (iVar3 <= (int)uVar1)) break;
          uVar2 = uVar2 + 1;
        }
        if ((disp_error != 0) || (1 < g_opts_0)) {
          fprintf(_stderr,"** volume index %d (#%d) is out of range [0,%d]\n",(ulong)uVar1,
                  uVar2 & 0xffffffff,(ulong)(iVar3 - 1));
          return 0;
        }
      }
      return 0;
    }
    if ((disp_error == 0) && (g_opts_0 < 2)) {
      return 0;
    }
    __ptr = "** valid_nifti_brick_list: no brick list to check\n";
    sStack_10 = 0x32;
  }
  fwrite(__ptr,sStack_10,1,_stderr);
  return 0;
}

Assistant:

int valid_nifti_brick_list(nifti_image * nim , int nbricks,
                           const int * blist, int disp_error)
{
   int c, nsubs;

   if( !nim ){
      if( disp_error || g_opts.debug > 0 )
         fprintf(stderr,"** valid_nifti_brick_list: missing nifti image\n");
      return 0;
   }

   if( nbricks <= 0 || !blist ){
      if( disp_error || g_opts.debug > 1 )
         fprintf(stderr,"** valid_nifti_brick_list: no brick list to check\n");
      return 0;
   }

   if( nim->dim[0] < 3 ){
      if( disp_error || g_opts.debug > 1 )
         fprintf(stderr,"** cannot read explict brick list from %d-D dataset\n",
                 nim->dim[0]);
      return 0;
   }

   /* nsubs sub-brick is nt*nu*nv*nw */
   for( c = 4, nsubs = 1; c <= nim->dim[0]; c++ )
      nsubs *= nim->dim[c];

   if( nsubs <= 0 ){
      fprintf(stderr,"** VNBL warning: bad dim list (%d,%d,%d,%d)\n",
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7]);
      return 0;
   }

   for( c = 0; c < nbricks; c++ )
      if( (blist[c] < 0) || (blist[c] >= nsubs) ){
         if( disp_error || g_opts.debug > 1 )
            fprintf(stderr,
               "** volume index %d (#%d) is out of range [0,%d]\n",
               blist[c], c, nsubs-1);
         return 0;
      }

   return 1;  /* all is well */
}